

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsDomainGetEntities
              (FmsDomain domain,FmsEntityType type,int **reordering,FmsIntType ent_id_type,
              FmsInt first_ent,void *ents,FmsInt num_ents)

{
  FmsIntType src_type;
  FmsInt tuple_size;
  int *piVar1;
  long lVar2;
  int iVar3;
  void *src;
  FmsInt i;
  FmsInt FVar4;
  FmsInt aFStack_30 [3];
  
  if (domain == (FmsDomain)0x0) {
    iVar3 = 1;
  }
  else if (type - FMS_NUM_ENTITY_TYPES < 0xfffffff9) {
    iVar3 = 2;
  }
  else if (ent_id_type < FMS_NUM_INT_TYPES) {
    iVar3 = 0;
    if (num_ents != 0) {
      if (first_ent < domain->num_entities[type]) {
        if (ents == (void *)0x0) {
          iVar3 = 5;
        }
        else if (domain->num_entities[type] < num_ents + first_ent) {
          iVar3 = 6;
        }
        else if (domain->entities[type] == (void *)0x0) {
          iVar3 = 7;
        }
        else {
          src_type = domain->side_ids_type[type];
          tuple_size = FmsEntityNumSides[type];
          src = (void *)((long)domain->entities[type] +
                        first_ent * FmsIntTypeSize[src_type] * tuple_size);
          if ((reordering == (int **)0x0) || (piVar1 = reordering[type], piVar1 == (int *)0x0)) {
            aFStack_30[2] = 0x1097ac;
            FmsIntConvertCopy(src_type,src,ent_id_type,ents,tuple_size * num_ents);
            iVar3 = 0;
          }
          else {
            lVar2 = -(tuple_size * 4 + 0xf & 0xfffffffffffffff0);
            for (FVar4 = 0; tuple_size != FVar4; FVar4 = FVar4 + 1) {
              *(int *)((long)(&stack0xffffffffffffffe8 + lVar2) + (long)piVar1[FVar4] * 4) =
                   (int)FVar4;
            }
            *(FmsInt *)((long)aFStack_30 + lVar2 + 8) = num_ents * tuple_size;
            *(undefined8 *)((long)aFStack_30 + lVar2) = 0x1097d3;
            FmsIntPermuteConvertCopy
                      (src_type,src,ent_id_type,ents,(int *)(&stack0xffffffffffffffe8 + lVar2),
                       tuple_size,*(FmsInt *)((long)aFStack_30 + lVar2 + 8));
            iVar3 = 0;
          }
        }
      }
      else {
        iVar3 = 4;
      }
    }
  }
  else {
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

int FmsDomainGetEntities(FmsDomain domain, FmsEntityType type,
                         FmsEntityReordering reordering, FmsIntType ent_id_type,
                         FmsInt first_ent, void *ents, FmsInt num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type == FMS_VERTEX || type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (ent_id_type >= FMS_NUM_INT_TYPES) { E_RETURN(3); }
  if (num_ents == 0) { return 0; }
  if (first_ent >= domain->num_entities[type]) { E_RETURN(4); }
  if (!ents) { E_RETURN(5); }
  if (first_ent + num_ents > domain->num_entities[type]) { E_RETURN(6); }
  void *src_ents = domain->entities[type];
  if (!src_ents) { E_RETURN(7); }
  const FmsIntType side_ids_type = domain->side_ids_type[type];
  const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
  const FmsInt num_sides = FmsEntityNumSides[type];
  src_ents = (char*)src_ents + first_ent*num_sides*sizeof_side_ids;
  if (reordering == NULL || reordering[type] == NULL) {
    FmsIntConvertCopy(side_ids_type, src_ents, ent_id_type, ents,
                      num_ents*num_sides);
  } else {
    const int *perm = reordering[type];
    int inv_perm[num_sides]; // variable length array
    for (FmsInt i = 0; i < num_sides; i++) {
      inv_perm[perm[i]] = i;
    }
    FmsIntPermuteConvertCopy(side_ids_type, src_ents, ent_id_type, ents,
                             inv_perm, num_sides, num_ents*num_sides);
  }
  return 0;
}